

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzset_unlocked.c
# Opt level: O0

void settzname(void)

{
  ttinfo *ttisp_1;
  ttinfo *ttisp;
  int i;
  state *sp;
  
  for (ttisp._4_4_ = 0; ttisp._4_4_ < _PDCLIB_lclmem.typecnt; ttisp._4_4_ = ttisp._4_4_ + 1) {
    _PDCLIB_update_tzname_etc(&_PDCLIB_lclmem,_PDCLIB_lclmem.ttis + ttisp._4_4_);
  }
  for (ttisp._4_4_ = 0; ttisp._4_4_ < _PDCLIB_lclmem.timecnt; ttisp._4_4_ = ttisp._4_4_ + 1) {
    _PDCLIB_update_tzname_etc
              (&_PDCLIB_lclmem,_PDCLIB_lclmem.ttis + _PDCLIB_lclmem.types[ttisp._4_4_]);
  }
  return;
}

Assistant:

static void settzname( void )
{
    struct state * const sp = &_PDCLIB_lclmem;
    int                  i;

#if HAVE_TZNAME
    tzname[ 0 ] = tzname[ 1 ] = (char *) ( sp ? wildabbr : gmt );
#endif
#if USG_COMPAT
    daylight = 0;
    timezone = 0;
#endif
#if ALTZONE
    altzone = 0;
#endif
    if ( sp == NULL )
    {
        return;
    }
    /* And to get the latest time zone abbreviations into tzname... */
    for ( i = 0; i < sp->typecnt; ++i )
    {
        const struct ttinfo * const ttisp = &sp->ttis[ i ];
        _PDCLIB_update_tzname_etc( sp, ttisp );
    }

    for ( i = 0; i < sp->timecnt; ++i )
    {
        const struct ttinfo * const ttisp = &sp->ttis[ sp->types[ i ] ];
        _PDCLIB_update_tzname_etc( sp, ttisp );
#if USG_COMPAT
        if ( ttisp->isdst )
        {
            daylight = 1;
        }
#endif
    }
}